

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O0

void cast_cleric_spell(monst *mtmp,int dmg,int spellnum)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  permonst *ppVar4;
  monst *mtmp_00;
  char *pcVar5;
  long xtime;
  bool bVar6;
  int local_54;
  int local_50;
  int iStack_38;
  boolean oldprop;
  int num_eyes;
  int quan;
  coord bypos;
  int i;
  boolean success;
  char let;
  monst *mtmp2;
  permonst *pm;
  int spellnum_local;
  int dmg_local;
  monst *mtmp_local;
  
  if ((dmg == 0) && (bVar1 = is_undirected_spell(0xf0,spellnum), bVar1 == '\0')) {
    warning("cast directed cleric spell (%d) with dmg=0?",(ulong)(uint)spellnum);
    return;
  }
  pm._4_4_ = dmg;
  switch(spellnum) {
  case 0:
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
      shieldeff(u.ux,u.uy);
      pm._4_4_ = (dmg + 1) / 2;
    }
    if ((int)pm._4_4_ < 6) {
      pline("Your skin itches badly for a moment.");
    }
    else if ((int)pm._4_4_ < 0xb) {
      pline("Wounds appear on your body!");
    }
    else if ((int)pm._4_4_ < 0x15) {
      pline("Severe wounds appear on your body!");
    }
    else {
      pline("Your body is covered with painful wounds!");
    }
    break;
  case 1:
    if (mtmp->mhpmax <= mtmp->mhp) break;
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00213006;
      if (((((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          ((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
         ((mtmp->data->mflags3 & 0x200) != 0)) {
        bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x00213000;
      }
    }
    else {
      bVar2 = worm_known(level,mtmp);
joined_r0x00213000:
      if (bVar2 != 0) {
LAB_00213006:
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
        {
          pcVar5 = Monnam(mtmp);
          pline("%s looks better.",pcVar5);
        }
      }
    }
    iVar3 = dice(3,6);
    iVar3 = iVar3 + mtmp->mhp;
    mtmp->mhp = iVar3;
    if (mtmp->mhpmax < iVar3) {
      mtmp->mhp = mtmp->mhpmax;
    }
    pm._4_4_ = 0;
    break;
  case 2:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar1 = resists_magm(&youmonst), bVar1 == '\0')))) {
      bVar6 = u.uprops[0x1c].intrinsic != 0;
      pm._4_4_ = (uint)mtmp->m_lev;
      if ((u.uprops[0x32].intrinsic != 0) || (u.uprops[0x32].extrinsic != 0)) {
        pm._4_4_ = (pm._4_4_ + 1) / 2;
      }
      make_confused((ulong)(u.uprops[0x1c].intrinsic + pm._4_4_),'\x01');
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
        pcVar5 = "";
        if (bVar6) {
          pcVar5 = "more ";
        }
        pline("You feel %sconfused!",pcVar5);
      }
      else {
        pcVar5 = "trippy";
        if (bVar6) {
          pcVar5 = "trippier";
        }
        pline("You feel %s!",pcVar5);
      }
    }
    else {
      shieldeff(u.ux,u.uy);
      pline("You feel momentarily dizzy.");
    }
    pm._4_4_ = 0;
    break;
  case 3:
    if (((u.uprops[0x2c].extrinsic == 0) &&
        ((u.umonnum == u.umonster || (bVar1 = resists_magm(&youmonst), bVar1 == '\0')))) &&
       (u.uprops[0x38].extrinsic == 0)) {
      if (-1 < multi) {
        pline("You are frozen in place!");
      }
      pm._4_4_ = mtmp->m_lev + 4;
      if ((u.uprops[0x32].intrinsic != 0) || (u.uprops[0x32].extrinsic != 0)) {
        pm._4_4_ = (mtmp->m_lev + 5) / 2;
      }
      nomul(-pm._4_4_,"paralyzed by a monster");
    }
    else {
      shieldeff(u.ux,u.uy);
      if (-1 < multi) {
        pline("You stiffen briefly.");
      }
      nomul(-1,"paralyzed by a monster");
    }
    pm._4_4_ = 0;
    break;
  case 4:
    if (u.uprops[0x1e].intrinsic == 0) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        local_54 = 2;
        if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
          local_54 = 1;
        }
      }
      else {
        local_54 = 0;
      }
      if (local_54 == 1) {
        body_part(1);
      }
      else {
        pcVar5 = body_part(1);
        makeplural(pcVar5);
      }
      pline("Scales cover your %s!");
      xtime = 200;
      if (u.uprops[0x32].intrinsic != 0 || u.uprops[0x32].extrinsic != 0) {
        xtime = 100;
      }
      make_blinded(xtime,'\0');
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Your vision quickly clears.");
      }
      pm._4_4_ = 0;
    }
    else {
      warning("no reason for monster to cast blindness spell?");
    }
    break;
  case 5:
    ppVar4 = mkclass(&u.uz,'\x01',0);
    bypos.y = '-';
    if (ppVar4 != (permonst *)0x0) {
      bypos.y = '\x01';
    }
    if (mtmp->m_lev < 2) {
      local_50 = 1;
    }
    else {
      local_50 = rnd(mtmp->m_lev / 2);
    }
    iStack_38 = local_50;
    if (local_50 < 3) {
      iStack_38 = 3;
    }
    bypos.x = ppVar4 != (permonst *)0x0;
    quan = 0;
    while ((quan <= iStack_38 &&
           (bVar1 = enexto((coord *)((long)&num_eyes + 2),level,mtmp->mux,mtmp->muy,mtmp->data),
           bVar1 != '\0'))) {
      ppVar4 = mkclass(&u.uz,bypos.y,0);
      if ((ppVar4 != (permonst *)0x0) &&
         (mtmp_00 = makemon(ppVar4,level,(int)num_eyes._2_1_,(int)num_eyes._3_1_,0),
         mtmp_00 != (monst *)0x0)) {
        bypos.x = '\x01';
        mtmp_00->mtame = '\0';
        *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffbfffff;
        *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xfff7ffff;
        set_malign(mtmp_00);
      }
      quan = quan + 1;
    }
    if (bypos.x == '\0') {
      pcVar5 = Monnam(mtmp);
      pline("%s casts at a clump of sticks, but nothing happens.",pcVar5);
    }
    else if (bypos.y == '-') {
      pcVar5 = Monnam(mtmp);
      pline("%s transforms a clump of sticks into snakes!",pcVar5);
    }
    else if ((((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
               (youmonst.data != mons + 0x9e)) && (youmonst.data != mons + 0x7b)) ||
             (((u.uprops[0xd].blocked != 0 || (u.uprops[0xc].intrinsic != 0)) ||
              ((u.uprops[0xc].extrinsic != 0 ||
               ((((youmonst.data)->mflags1 & 0x1000000) != 0 ||
                ((mtmp->data->mflags1 & 0x1000000) != 0)))))))) ||
            ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
      if ((u.uprops[0x2d].extrinsic == 0) || ((mtmp->mux == u.ux && (mtmp->muy == u.uy)))) {
        pcVar5 = Monnam(mtmp);
        pline("%s summons insects!",pcVar5);
      }
      else {
        pcVar5 = Monnam(mtmp);
        pline("%s summons insects around your displaced image!",pcVar5);
      }
    }
    else {
      pcVar5 = Monnam(mtmp);
      pline("%s summons insects around a spot near you!",pcVar5);
    }
    pm._4_4_ = 0;
    break;
  case 6:
    pline("You feel as if you need some help.");
    rndcurse();
    pm._4_4_ = 0;
    break;
  case 7:
    pline("A bolt of lightning strikes down at you from above!");
    bVar1 = ureflects("It bounces off your %s%s.","");
    if (bVar1 == '\0') {
      iVar3 = 8;
      if (u.uprops[0x32].intrinsic != 0 || u.uprops[0x32].extrinsic != 0) {
        iVar3 = 4;
      }
      iVar3 = dice(iVar3,6);
      elec_damageu(iVar3,mtmp,(char *)0x0,0,0x14,'\x01');
    }
    pm._4_4_ = 0;
    break;
  case 8:
    pline("A pillar of fire strikes all around you!");
    iVar3 = 8;
    if (u.uprops[0x32].intrinsic != 0 || u.uprops[0x32].extrinsic != 0) {
      iVar3 = 4;
    }
    iVar3 = dice(iVar3,6);
    fire_damageu(iVar3,mtmp,(char *)0x0,0,0x14,'\x01','\x01');
    burn_floor_paper((int)u.ux,(int)u.uy,'\x01','\0');
    pm._4_4_ = 0;
    break;
  case 9:
    pline("A sudden geyser slams into you from nowhere!");
    pm._4_4_ = dice(8,6);
    if ((u.uprops[0x33].intrinsic != 0) || (u.uprops[0x33].extrinsic != 0)) {
      pm._4_4_ = (int)(pm._4_4_ + 1) / 2;
    }
    break;
  default:
    warning("mcastu: invalid clerical spell (%d)",(ulong)(uint)spellnum);
    pm._4_4_ = 0;
  }
  if (pm._4_4_ != 0) {
    mdamageu(mtmp,pm._4_4_);
  }
  return;
}

Assistant:

static void cast_cleric_spell(struct monst *mtmp, int dmg, int spellnum)
{
    if (dmg == 0 && !is_undirected_spell(AD_CLRC, spellnum)) {
	warning("cast directed cleric spell (%d) with dmg=0?", spellnum);
	return;
    }

    switch (spellnum) {
    case CLC_GEYSER:
	/* this is physical damage, not magical damage */
	pline("A sudden geyser slams into you from nowhere!");
	dmg = dice(8, 6);
	if (Half_physical_damage) dmg = (dmg + 1) / 2;
	break;
    case CLC_FIRE_PILLAR:
	pline("A pillar of fire strikes all around you!");
	fire_damageu(dice(Half_spell_damage ? 4 : 8, 6), mtmp, NULL, 0,
		     20, TRUE, TRUE);
	burn_floor_paper(u.ux, u.uy, TRUE, FALSE);
	dmg = 0;
	break;
    case CLC_LIGHTNING:
	pline("A bolt of lightning strikes down at you from above!");
	if (!ureflects("It bounces off your %s%s.", "")) {
	    elec_damageu(dice(Half_spell_damage ? 4 : 8, 6),
			 mtmp, NULL, 0, 20, TRUE);
	}
	dmg = 0;
	break;
    case CLC_CURSE_ITEMS:
	pline("You feel as if you need some help.");
	rndcurse();
	dmg = 0;
	break;
    case CLC_INSECTS:
      {
	/* Try for insects, and if there are none
	   left, go for (sticks to) snakes.  -3. */
	const struct permonst *pm = mkclass(&u.uz, S_ANT,0);
	struct monst *mtmp2 = NULL;
	char let = (pm ? S_ANT : S_SNAKE);
	boolean success;
	int i;
	coord bypos;
	int quan;

	quan = (mtmp->m_lev < 2) ? 1 : rnd((int)mtmp->m_lev / 2);
	if (quan < 3) quan = 3;
	success = pm ? TRUE : FALSE;
	for (i = 0; i <= quan; i++) {
	    if (!enexto(&bypos, level, mtmp->mux, mtmp->muy, mtmp->data))
		break;
	    if ((pm = mkclass(&u.uz, let,0)) != 0 &&
		    (mtmp2 = makemon(pm, level, bypos.x, bypos.y, NO_MM_FLAGS)) != 0) {
		success = TRUE;
		mtmp2->msleeping = mtmp2->mpeaceful = mtmp2->mtame = 0;
		set_malign(mtmp2);
	    }
	}
	/* Not quite right:
         * -- message doesn't always make sense for unseen caster (particularly
	 *    the first message)
         * -- message assumes plural monsters summoned (non-plural should be
         *    very rare, unlike in nasty())
         * -- message assumes plural monsters seen
         */
	if (!success)
	    pline("%s casts at a clump of sticks, but nothing happens.",
		Monnam(mtmp));
	else if (let == S_SNAKE)
	    pline("%s transforms a clump of sticks into snakes!",
		Monnam(mtmp));
	else if (Invisible && !perceives(mtmp->data) &&
				(mtmp->mux != u.ux || mtmp->muy != u.uy))
	    pline("%s summons insects around a spot near you!",
		Monnam(mtmp));
	else if (Displaced && (mtmp->mux != u.ux || mtmp->muy != u.uy))
	    pline("%s summons insects around your displaced image!",
		Monnam(mtmp));
	else
	    pline("%s summons insects!", Monnam(mtmp));
	dmg = 0;
	break;
      }
    case CLC_BLIND_YOU:
	/* note: resists_blnd() doesn't apply here */
	if (!Blinded) {
	    int num_eyes = eyecount(youmonst.data);
	    pline("Scales cover your %s!",
		  (num_eyes == 1) ?
		  body_part(EYE) : makeplural(body_part(EYE)));
	    make_blinded(Half_spell_damage ? 100L : 200L, FALSE);
	    if (!Blind) pline("Your vision quickly clears.");
	    dmg = 0;
	} else
	    warning("no reason for monster to cast blindness spell?");
	break;
    case CLC_PARALYZE:
	if (Antimagic || Free_action) {
	    shieldeff(u.ux, u.uy);
	    if (multi >= 0)
		pline("You stiffen briefly.");
	    nomul(-1, "paralyzed by a monster");
	} else {
	    if (multi >= 0)
		pline("You are frozen in place!");
	    dmg = 4 + (int)mtmp->m_lev;
	    if (Half_spell_damage) dmg = (dmg + 1) / 2;
	    nomul(-dmg, "paralyzed by a monster");
	}
	dmg = 0;
	break;
    case CLC_CONFUSE_YOU:
	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    pline("You feel momentarily dizzy.");
	} else {
	    boolean oldprop = !!Confusion;

	    dmg = (int)mtmp->m_lev;
	    if (Half_spell_damage) dmg = (dmg + 1) / 2;
	    make_confused(HConfusion + dmg, TRUE);
	    if (Hallucination)
		pline("You feel %s!", oldprop ? "trippier" : "trippy");
	    else
		pline("You feel %sconfused!", oldprop ? "more " : "");
	}
	dmg = 0;
	break;
    case CLC_CURE_SELF:
	if (mtmp->mhp < mtmp->mhpmax) {
	    if (canseemon(level, mtmp))
		pline("%s looks better.", Monnam(mtmp));
	    /* note: player healing does 6d4; this used to do 1d8 */
	    if ((mtmp->mhp += dice(3,6)) > mtmp->mhpmax)
		mtmp->mhp = mtmp->mhpmax;
	    dmg = 0;
	}
	break;
    case CLC_OPEN_WOUNDS:
	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    dmg = (dmg + 1) / 2;
	}
	if (dmg <= 5)
	    pline("Your skin itches badly for a moment.");
	else if (dmg <= 10)
	    pline("Wounds appear on your body!");
	else if (dmg <= 20)
	    pline("Severe wounds appear on your body!");
	else
	    pline("Your body is covered with painful wounds!");
	break;
    default:
	warning("mcastu: invalid clerical spell (%d)", spellnum);
	dmg = 0;
	break;
    }

    if (dmg) mdamageu(mtmp, dmg);
}